

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QString>::reallocate
          (QMovableArrayOps<QString> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QString>_*,_QString_*> pVar1;
  
  pVar1 = QTypedArrayData<QString>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d,
                     (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr,
                     alloc,option);
  (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d = pVar1.first;
  (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }